

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O0

void __thiscall jrtplib::RTCPCompoundPacketBuilder::SDESSource::~SDESSource(SDESSource *this)

{
  uint8_t *buf;
  bool bVar1;
  reference pBVar2;
  RTPMemoryManager *mgr;
  iterator local_38;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_30;
  iterator local_28;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_20;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer> local_18;
  const_iterator it;
  SDESSource *this_local;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__SDESSource_001ad810;
  it._M_node = (_List_node_base *)this;
  std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::_List_const_iterator
            (&local_18);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
       ::begin(&this->items);
  std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::_List_const_iterator
            (&local_20,&local_28);
  local_18._M_node = local_20._M_node;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
         ::end(&this->items);
    std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::_List_const_iterator
              (&local_30,&local_38);
    bVar1 = std::operator!=(&local_18,&local_30);
    if (!bVar1) break;
    pBVar2 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator*
                       (&local_18);
    if (pBVar2->packetdata != (uint8_t *)0x0) {
      pBVar2 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator*
                         (&local_18);
      buf = pBVar2->packetdata;
      mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
      RTPDeleteByteArray(buf,mgr);
    }
    std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::Buffer>::operator++(&local_18,0);
  }
  std::__cxx11::
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ::clear(&this->items);
  std::__cxx11::
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ::~list(&this->items);
  RTPMemoryObject::~RTPMemoryObject(&this->super_RTPMemoryObject);
  return;
}

Assistant:

~SDESSource()
		{
			std::list<Buffer>::const_iterator it;
			for (it = items.begin() ; it != items.end() ; it++)
			{
				if ((*it).packetdata)
					RTPDeleteByteArray((*it).packetdata,GetMemoryManager());
			}
			items.clear();
		}